

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool ON_ModelComponent::IsValidComponentName
               (ON_ComponentManifest *model_manfest,ON_ModelComponent *model_component,
               bool bPermitReferencePrefix,ON_wString *valid_name)

{
  Type TVar1;
  uchar auVar2 [8];
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ON_ComponentManifestItem *pOVar6;
  ON__UINT64 OVar7;
  wchar_t *pwVar8;
  wchar_t *base_name;
  uint uVar9;
  ON_UUID OVar10;
  ON_UUID component_parent_id;
  ON_wString ref;
  ON_wString leaf;
  ON_wString parent;
  ON_wString original_name;
  uint in_stack_ffffffffffffff8c;
  ON_ComponentManifest local_68;
  ON_wString local_60;
  uint local_54;
  ON_ComponentManifest *local_50;
  ON_wString local_48;
  
  local_50 = model_manfest;
  ON_wString::operator=(valid_name,&ON_wString::EmptyString);
  TVar1 = model_component->m_component_type;
  Name((ON_ModelComponent *)&stack0xffffffffffffffc0);
  bVar3 = IsValidComponentName((ON_wString *)&stack0xffffffffffffffc0);
  uVar9 = (uint)TVar1;
  if (bVar3) {
    local_54 = (uint)TVar1;
    bVar3 = UniqueNameRequired(TVar1);
    if (!bPermitReferencePrefix || bVar3) {
      if (bVar3) {
        pOVar6 = ON_ComponentManifest::ItemFromName(local_50,model_component);
      }
      else {
        pOVar6 = &ON_ComponentManifestItem::UnsetItem;
      }
      OVar7 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(pOVar6);
      bVar5 = true;
      if (OVar7 != model_component->m_runtime_serial_number) {
        bVar4 = ON_ComponentManifestItem::IsUnset(pOVar6);
        if (!bVar4) {
          bVar5 = ON_ComponentManifestItem::IsSystemComponent(pOVar6);
        }
      }
      if ((bVar5 & bPermitReferencePrefix) == 0) {
        ON_wString::ON_wString((ON_wString *)&local_68);
        ON_wString::ON_wString(&local_48);
        ON_wString::ON_wString(&local_60);
        pwVar8 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffc0);
        SplitName(pwVar8,(ON_wString *)&local_68,&local_48,&local_60);
        if (bVar5 != false) {
          bVar5 = ON_wString::IsEmpty((ON_wString *)&local_68);
          if (bVar5) {
            ON_wString::~ON_wString(&local_60);
            ON_wString::~ON_wString(&local_48);
            ON_wString::~ON_wString((ON_wString *)&local_68);
            goto LAB_00546260;
          }
        }
        bVar5 = IsValidComponentName(&local_60);
        if (bVar5) {
          if (bVar3) {
            OVar10 = model_component->m_component_parent_id;
            pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_60);
            pOVar6 = ON_ComponentManifest::ItemFromName(local_50,(Type)local_54,OVar10,pwVar8);
          }
          else {
            pOVar6 = &ON_ComponentManifestItem::UnsetItem;
          }
          bVar3 = ON_ComponentManifestItem::IsUnset(pOVar6);
          if (!bVar3) {
            bVar3 = ON_ComponentManifestItem::IsSystemComponent(pOVar6);
            if (!bVar3) {
              TVar1 = model_component->m_component_type;
              auVar2 = *(uchar (*) [8])&model_component->m_component_parent_id;
              pwVar8 = *(wchar_t **)(model_component->m_component_parent_id).Data4;
              base_name = ON_wString::operator_cast_to_wchar_t_(&local_60);
              OVar10._1_7_ = 0;
              OVar10.Data1._0_1_ = TVar1;
              OVar10.Data4 = auVar2;
              ON_ComponentManifest::UnusedName
                        ((ON_ComponentManifest *)&stack0xffffffffffffffc8,(Type)local_50,OVar10,
                         pwVar8,base_name,(wchar_t *)0x0,0,
                         (uint *)((ulong)in_stack_ffffffffffffff8c << 0x20));
              ON_wString::operator=(valid_name,(ON_wString *)&stack0xffffffffffffffc8);
              ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc8);
              goto LAB_005463b8;
            }
          }
          ON_wString::operator=(valid_name,&local_60);
        }
LAB_005463b8:
        ON_wString::~ON_wString(&local_60);
        ON_wString::~ON_wString(&local_48);
        ON_wString::~ON_wString((ON_wString *)&local_68);
        uVar9 = local_54;
        goto LAB_005463da;
      }
    }
LAB_00546260:
    bVar3 = true;
    ON_wString::operator=(valid_name,(ON_wString *)&stack0xffffffffffffffc0);
  }
  else {
LAB_005463da:
    bVar3 = ON_wString::IsEmpty(valid_name);
    if (bVar3) {
      component_parent_id.Data2 = 0;
      component_parent_id.Data3 = 0;
      component_parent_id.Data1 = uVar9;
      component_parent_id.Data4 = *(uchar (*) [8])&model_component->m_component_parent_id;
      ON_ComponentManifest::UnusedName
                (&local_68,(Type)local_50,component_parent_id,
                 *(wchar_t **)(model_component->m_component_parent_id).Data4,(wchar_t *)0x0,
                 (wchar_t *)0x0,0,(uint *)((ulong)in_stack_ffffffffffffff8c << 0x20));
      ON_wString::operator=(valid_name,(ON_wString *)&local_68);
      ON_wString::~ON_wString((ON_wString *)&local_68);
    }
    bVar3 = false;
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc0);
  return bVar3;
}

Assistant:

bool ON_ModelComponent::IsValidComponentName(
  const class ON_ComponentManifest&  model_manfest,
  const ON_ModelComponent& model_component,
  bool bPermitReferencePrefix,
  ON_wString& valid_name
)
{
  valid_name = ON_wString::EmptyString;
  const ON_ModelComponent::Type model_component_type = model_component.ComponentType();

  const ON_wString original_name = model_component.Name();

  bool rc = false;
  for (;;)
  {
    if (false == ON_ModelComponent::IsValidComponentName(original_name))
    {
      break;
    }

    const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(model_component_type);
    if (bPermitReferencePrefix && false == bUniqueNameRequired)
    {
      rc = true;
      break;
    }

    const class ON_ComponentManifestItem& item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(&model_component)
      : ON_ComponentManifestItem::UnsetItem;

    const bool bItemFromNameIsOK
      =  (item.ComponentRuntimeSerialNumber() == model_component.RuntimeSerialNumber())
      || item.IsUnset()
      || item.IsSystemComponent()
      ;

    if ( bItemFromNameIsOK && bPermitReferencePrefix)
    {
      rc = true;
      break;
    }

    ON_wString ref;
    ON_wString parent;
    ON_wString leaf;
    ON_ModelComponent::SplitName(
      original_name,
      ref,
      parent,
      leaf
    );
    if (bItemFromNameIsOK && ref.IsEmpty())
    {
      rc = true;
      break;
    }

    if (false == ON_ModelComponent::IsValidComponentName(leaf))
      break;

    const class ON_ComponentManifestItem& leaf_item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(model_component_type,model_component.ParentId(),leaf)
      : ON_ComponentManifestItem::UnsetItem;

    if (leaf_item.IsUnset() || leaf_item.IsSystemComponent())
    {
      valid_name = leaf;
      break;
    }

    valid_name = model_manfest.UnusedName(
      model_component.ComponentType(),
      model_component.ParentId(),
      leaf,
      nullptr,
      nullptr,
      0,
      nullptr
    );

    break;
  }

  if (rc)
  {
    valid_name = original_name;
  }
  else if (valid_name.IsEmpty())
  {
    valid_name = model_manfest.UnusedName(
      model_component_type,
      model_component.ParentId(),
      nullptr,
      nullptr,
      nullptr,
      0,
      nullptr
    );
  }

  return rc;
}